

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v7::detail::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  char *__s;
  int iVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  byte *__s_00;
  byte *pbVar7;
  char *pcVar8;
  int iVar9;
  ptrdiff_t _Num;
  ulong uVar10;
  uint uVar11;
  size_t sVar12;
  uint uVar13;
  ptrdiff_t _Num_2;
  
  iVar9 = this->num_digits_;
  uVar13 = this->exp_ + iVar9;
  if ((this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    iVar9 = this->num_digits_;
    iVar1 = (this->specs_).precision;
    if ((iVar9 < 2) && (((this->specs_).field_0x6 & 0x10) == 0)) {
      pcVar6 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pcVar6 = it + 2;
    }
    uVar11 = iVar1 - iVar9;
    sVar12 = (long)this->num_digits_ - 1;
    if ((long)this->num_digits_ != 1) {
      memmove(pcVar6,this->digits_ + 1,sVar12);
    }
    __s_00 = (byte *)(pcVar6 + sVar12);
    pbVar7 = __s_00;
    if ((0 < (int)uVar11) && (((this->specs_).field_0x6 & 0x10) != 0)) {
      pbVar7 = __s_00 + uVar11;
      memset(__s_00,0x30,(ulong)uVar11);
    }
    *pbVar7 = ((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pcVar6 = write_exponent<char,char*>(uVar13 - 1,(char *)(pbVar7 + 1));
    return pcVar6;
  }
  if (this->exp_ < 0) {
    if ((int)uVar13 < 1) {
      *it = '0';
      uVar11 = -uVar13;
      uVar10 = (ulong)(uint)this->num_digits_;
      if (uVar10 == 0) {
        uVar2 = (this->specs_).precision;
        uVar4 = uVar11;
        if (SBORROW4(uVar2,uVar11) != (int)(uVar2 + uVar13) < 0) {
          uVar4 = uVar2;
        }
        if (-1 < (int)uVar2) {
          uVar11 = uVar4;
        }
      }
      uVar13 = *(uint *)&(this->specs_).field_0x4 & 0x100000;
      if (0 < this->num_digits_ && (char)(uVar13 >> 0x14) == '\0') {
        do {
          if (this->digits_[uVar10 - 1] != '0') goto LAB_00230f8a;
          bVar3 = 1 < (long)uVar10;
          uVar10 = uVar10 - 1;
        } while (bVar3);
        uVar10 = 0;
      }
LAB_00230f8a:
      iVar9 = (int)uVar10;
      if ((uVar13 == 0 && uVar11 == 0) && iVar9 == 0) {
        pcVar6 = it + 1;
      }
      else {
        it[1] = this->decimal_point_;
        pcVar8 = it + 2;
        pcVar6 = pcVar8;
        if (0 < (int)uVar11) {
          pcVar6 = pcVar8 + uVar11;
          memset(pcVar8,0x30,(ulong)uVar11);
        }
        if (iVar9 != 0) {
          memmove(pcVar6,this->digits_,(long)iVar9);
        }
        pcVar6 = pcVar6 + iVar9;
      }
    }
    else {
      uVar10 = (ulong)uVar13;
      memmove(it,this->digits_,uVar10);
      pcVar6 = it + uVar10;
      if (((this->specs_).field_0x6 & 0x10) == 0) {
        uVar11 = this->num_digits_;
        uVar5 = (ulong)uVar11;
        if ((int)uVar13 < (int)uVar11) {
          uVar5 = (ulong)(int)uVar11;
          do {
            if (this->digits_[uVar5 - 1] != '0') goto LAB_00230f02;
            uVar5 = uVar5 - 1;
          } while ((long)uVar10 < (long)uVar5);
          uVar5 = (ulong)uVar13;
        }
LAB_00230f02:
        uVar11 = (uint)uVar5;
        if (uVar11 != uVar13) {
          *pcVar6 = this->decimal_point_;
          pcVar6 = pcVar6 + 1;
        }
        if (uVar11 != uVar13) {
          memmove(pcVar6,this->digits_ + uVar10,(long)(int)uVar11 - uVar10);
        }
        pcVar6 = pcVar6 + ((long)(int)uVar11 - uVar10);
      }
      else {
        *pcVar6 = this->decimal_point_;
        sVar12 = (long)this->num_digits_ - uVar10;
        if (this->num_digits_ != uVar13) {
          memmove(pcVar6 + 1,this->digits_ + uVar10,sVar12);
        }
        pcVar6 = pcVar6 + 1 + sVar12;
        iVar9 = (this->specs_).precision;
        iVar1 = this->num_digits_;
        uVar13 = iVar9 - iVar1;
        if ((uVar13 != 0 && iVar1 <= iVar9) && (uVar13 != 0 && iVar1 <= iVar9)) {
          memset(pcVar6,0x30,(ulong)uVar13);
          pcVar6 = pcVar6 + uVar13;
        }
      }
    }
  }
  else {
    if (iVar9 != 0) {
      memmove(it,this->digits_,(long)iVar9);
    }
    pcVar6 = it + iVar9;
    uVar11 = uVar13 - this->num_digits_;
    pcVar8 = pcVar6;
    if (uVar11 != 0 && this->num_digits_ <= (int)uVar13) {
      pcVar8 = pcVar6 + uVar11;
      memset(pcVar6,0x30,(ulong)uVar11);
    }
    if ((((this->specs_).field_0x6 & 0x10) != 0) || (pcVar6 = pcVar8, (this->specs_).precision < 0))
    {
      __s = pcVar8 + 1;
      *pcVar8 = this->decimal_point_;
      iVar9 = (this->specs_).precision;
      uVar11 = iVar9 - uVar13;
      if (uVar11 == 0 || iVar9 < (int)uVar13) {
        pcVar6 = __s;
        if ((this->specs_).field_0x4 != '\x02') {
          pcVar8[1] = '0';
          pcVar6 = pcVar8 + 2;
        }
      }
      else {
        pcVar6 = __s + uVar11;
        memset(__s,0x30,(ulong)uVar11);
      }
    }
  }
  return pcVar6;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      if (num_digits_ > 1 || specs_.showpoint) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (num_zeros > 0 && specs_.showpoint)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.showpoint || specs_.precision < 0) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FMT_FUZZ
        if (num_zeros > 5000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.showpoint) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      int num_digits = num_digits_;
      if (num_digits == 0 && specs_.precision >= 0 &&
          specs_.precision < num_zeros) {
        num_zeros = specs_.precision;
      }
      // Remove trailing zeros.
      if (!specs_.showpoint)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0 || specs_.showpoint) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }